

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_io.cc
# Opt level: O0

void __thiscall
gimage::PNMImageIO::load
          (PNMImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  bool bVar1;
  store_t v_00;
  _Ios_Iostate __a;
  uint uVar2;
  ulong uVar3;
  undefined8 uVar4;
  int *piVar5;
  long *plVar6;
  char *in_RDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  pos_type pVar7;
  fpos<__mbstate_t> fVar8;
  long in_stack_00000008;
  long in_stack_00000010;
  failure *ex;
  int d_2;
  long i_2;
  long k_1;
  streambuf *sb_1;
  int d_1;
  long i_1;
  long j;
  store_t v;
  int d;
  int ii;
  long i;
  long j_1;
  streambuf *sb;
  long kk;
  long k;
  valarray<int> nline;
  valarray<int> vline;
  ifstream in;
  pos_type pos;
  int depth;
  float scale;
  long maxval;
  long height;
  long width;
  undefined7 in_stack_fffffffffffff958;
  store_t in_stack_fffffffffffff95f;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffff960;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff968;
  valarray<int> *in_stack_fffffffffffff970;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffff980;
  long lVar9;
  string *in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a4;
  int iVar10;
  long in_stack_fffffffffffff9a8;
  long in_stack_fffffffffffff9b0;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *pIVar11;
  long in_stack_fffffffffffff9b8;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffff9c0;
  long k_00;
  int local_4f4;
  long local_4f0;
  long local_4e8;
  int local_4bc;
  long local_4b8 [3];
  long local_4a0 [3];
  byte local_481;
  int local_480;
  int local_47c;
  long local_478 [3];
  long local_460 [3];
  undefined8 local_448;
  long local_440;
  fpos<__mbstate_t> local_438;
  fpos<__mbstate_t> local_428;
  long local_418;
  undefined4 local_410;
  undefined4 local_40c;
  long local_408 [3];
  undefined4 local_3ec;
  valarray<int> local_3e8;
  undefined4 local_3d4;
  valarray<int> local_3d0;
  long local_3c0 [65];
  int local_1b8;
  undefined1 local_1b2;
  allocator local_1b1;
  string local_1b0 [102];
  undefined1 local_14a;
  allocator local_149;
  string local_148 [96];
  pos_type local_e8;
  undefined1 local_d5;
  long *in_stack_ffffffffffffff30;
  long *in_stack_ffffffffffffff38;
  float *in_stack_ffffffffffffff40;
  long *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  int local_50;
  float local_4c;
  long local_48;
  long local_40;
  long local_38;
  long local_28;
  int local_1c;
  char *local_18;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_10;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)0x167c03);
  uVar3 = (**(code **)(*in_RDI + 0x18))(in_RDI,local_18,1);
  if ((uVar3 & 1) == 0) {
    local_d5 = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff40,local_18,(allocator *)&stack0xffffffffffffff3f);
    std::operator+((char *)in_stack_fffffffffffff968,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff960);
    std::operator+(in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960);
    gutil::IOException::IOException
              ((IOException *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
               in_stack_fffffffffffff998);
    local_d5 = 0;
    __cxa_throw(uVar4,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  pVar7 = anon_unknown_11::readPNMHeader
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                     in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  local_e8 = pVar7;
  if ((local_4c == 0.0) && (!NAN(local_4c))) {
    if (0xff < local_48) {
      local_1b2 = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b0,local_18,&local_1b1);
      std::operator+((char *)in_stack_fffffffffffff968,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff960);
      std::operator+(in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960);
      gutil::IOException::IOException
                ((IOException *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                 in_stack_fffffffffffff998);
      local_1b2 = 0;
      __cxa_throw(uVar4,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
    }
    local_1b8 = 1;
    piVar5 = std::max<int>(&local_1b8,&local_1c);
    local_1c = *piVar5;
    if (in_stack_00000008 < 0) {
      in_stack_00000008 = (local_38 + local_1c + -1) / (long)local_1c;
    }
    if (in_stack_00000010 < 0) {
      in_stack_00000010 = (local_40 + local_1c + -1) / (long)local_1c;
    }
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,
               in_stack_fffffffffffff9a8);
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::clear(in_stack_fffffffffffff980);
    std::ifstream::ifstream(local_3c0);
    uVar4 = *(undefined8 *)(local_3c0[0] + -0x18);
    __a = std::operator|(_S_failbit,_S_badbit);
    std::operator|(__a,_S_eofbit);
    std::ios::exceptions((int)local_3c0 + (int)uVar4);
    std::ifstream::open((char *)local_3c0,(_Ios_Openmode)local_18);
    if ((((local_1c < 2) && (local_28 == 0)) && (in_R9 == 0)) &&
       ((in_stack_00000008 == local_38 && (in_stack_00000010 == local_40)))) {
      std::istream::seekg(local_3c0,pVar7._M_off,pVar7._M_state);
      std::ifstream::rdbuf();
      local_4e8 = 0;
      while( true ) {
        if (local_40 <= local_4e8) break;
        for (local_4f0 = 0; local_4f0 < local_38; local_4f0 = local_4f0 + 1) {
          for (local_4f4 = 0; pIVar11 = local_10, local_4f4 < local_50; local_4f4 = local_4f4 + 1) {
            lVar9 = local_4f0;
            v_00 = std::streambuf::sbumpc();
            Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                      (pIVar11,lVar9,local_4e8,local_4f4,v_00);
          }
        }
        local_4e8 = local_4e8 + 1;
      }
    }
    else {
      local_3d4 = 0;
      std::valarray<int>::valarray
                (in_stack_fffffffffffff970,(int *)in_stack_fffffffffffff968,
                 (size_t)in_stack_fffffffffffff960);
      local_3ec = 0;
      std::valarray<int>::valarray
                (in_stack_fffffffffffff970,(int *)in_stack_fffffffffffff968,
                 (size_t)in_stack_fffffffffffff960);
      local_408[1] = 0;
      local_408[0] = -in_R9;
      plVar6 = std::max<long>(local_408 + 1,local_408);
      for (local_408[2] = *plVar6;
          local_408[2] < in_stack_00000010 && (in_R9 + local_408[2]) * (long)local_1c < local_40;
          local_408[2] = local_408[2] + 1) {
        local_40c = 0;
        std::valarray<int>::operator=
                  ((valarray<int> *)in_stack_fffffffffffff960,
                   (int *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
        local_410 = 0;
        std::valarray<int>::operator=
                  ((valarray<int> *)in_stack_fffffffffffff960,
                   (int *)CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958));
        local_418 = 0;
        while( true ) {
          bVar1 = false;
          if (local_418 < local_1c) {
            bVar1 = local_418 + (in_R9 + local_408[2]) * (long)local_1c < local_40;
          }
          if (!bVar1) break;
          fVar8 = std::fpos<__mbstate_t>::operator+
                            ((fpos<__mbstate_t> *)
                             CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),0x1684f4)
          ;
          local_440 = 0;
          local_438 = fVar8;
          std::max<long>(&local_440,&local_28);
          fVar8 = std::fpos<__mbstate_t>::operator+
                            ((fpos<__mbstate_t> *)
                             CONCAT17(in_stack_fffffffffffff95f,in_stack_fffffffffffff958),0x168581)
          ;
          local_428 = fVar8;
          std::istream::seekg(local_3c0,fVar8._M_off,fVar8._M_state);
          local_448 = std::ifstream::rdbuf();
          local_460[1] = 0;
          local_460[0] = -local_28;
          plVar6 = std::max<long>(local_460 + 1,local_460);
          local_460[2] = *plVar6 * (long)local_50;
          local_478[1] = 0;
          local_478[0] = -local_28;
          plVar6 = std::max<long>(local_478 + 1,local_478);
          for (local_478[2] = *plVar6;
              local_478[2] < in_stack_00000008 &&
              (local_28 + local_478[2]) * (long)local_1c < local_38; local_478[2] = local_478[2] + 1
              ) {
            local_47c = 0;
            while( true ) {
              bVar1 = false;
              if (local_47c < local_1c) {
                bVar1 = (local_28 + local_478[2]) * (long)local_1c + (long)local_47c < local_38;
              }
              if (!bVar1) break;
              for (local_480 = 0; local_480 < local_50; local_480 = local_480 + 1) {
                local_481 = std::streambuf::sbumpc();
                bVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::isValidS
                                  (in_stack_fffffffffffff960,in_stack_fffffffffffff95f);
                if (bVar1) {
                  uVar2 = (uint)local_481;
                  piVar5 = std::valarray<int>::operator[](&local_3d0,local_460[2] + local_480);
                  *piVar5 = *piVar5 + uVar2;
                  piVar5 = std::valarray<int>::operator[](&local_3e8,local_460[2] + local_480);
                  *piVar5 = *piVar5 + 1;
                }
              }
              local_47c = local_47c + 1;
            }
            local_460[2] = local_50 + local_460[2];
          }
          local_418 = local_418 + 1;
        }
        local_4a0[1] = 0;
        local_4a0[0] = -local_28;
        plVar6 = std::max<long>(local_4a0 + 1,local_4a0);
        local_4a0[2] = *plVar6 * (long)local_50;
        local_4b8[1] = 0;
        local_4b8[0] = -local_28;
        plVar6 = std::max<long>(local_4b8 + 1,local_4b8);
        for (local_4b8[2] = *plVar6;
            local_4b8[2] < in_stack_00000008 &&
            (local_28 + local_4b8[2]) * (long)local_1c < local_38; local_4b8[2] = local_4b8[2] + 1)
        {
          for (local_4bc = 0; local_4bc < local_50; local_4bc = local_4bc + 1) {
            piVar5 = std::valarray<int>::operator[](&local_3e8,local_4a0[2]);
            if (0 < *piVar5) {
              pIVar11 = local_10;
              lVar9 = local_4b8[2];
              k_00 = local_408[2];
              piVar5 = std::valarray<int>::operator[](&local_3d0,local_4a0[2]);
              iVar10 = *piVar5;
              piVar5 = std::valarray<int>::operator[](&local_3e8,local_4a0[2]);
              Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                        (pIVar11,lVar9,k_00,local_4bc,(store_t)(iVar10 / *piVar5));
            }
            local_4a0[2] = local_4a0[2] + 1;
          }
        }
      }
      std::valarray<int>::~valarray((valarray<int> *)in_stack_fffffffffffff960);
      std::valarray<int>::~valarray((valarray<int> *)in_stack_fffffffffffff960);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(local_3c0);
    return;
  }
  local_14a = 1;
  uVar4 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,local_18,&local_149);
  std::operator+((char *)in_stack_fffffffffffff968,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff960);
  std::operator+(in_stack_fffffffffffff968,(char *)in_stack_fffffffffffff960);
  gutil::IOException::IOException
            ((IOException *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
             in_stack_fffffffffffff998);
  local_14a = 0;
  __cxa_throw(uVar4,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

void PNMImageIO::load(ImageU8 &image, const char *name, int ds, long x, long y,
                      long w, long h) const
{
  long  width, height, maxval;
  float scale;
  int   depth;
  std::istream::pos_type pos;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load PNM image ("+std::string(name)+")");
  }

  pos=readPNMHeader(name, depth, maxval, scale, width, height);

  if (scale != 0)
  {
    throw gutil::IOException("A float image cannot be loaded as 8 bit image ("+std::string(name)+")");
  }

  if (maxval > 255)
  {
    throw gutil::IOException("A 16 bit image cannot be loaded as 8 bit image ("+std::string(name)+")");
  }

  ds=std::max(1, ds);

  if (w < 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h < 0)
  {
    h=(height+ds-1)/ds;
  }

  image.setSize(w, h, depth);
  image.clear();

  try
  {
    std::ifstream in;
    in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
    in.open(name, std::ios::binary);

    // load downscaled part?

    if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
    {
      std::valarray<ImageU8::work_t> vline(0, w*depth);
      std::valarray<int> nline(0, w*depth);

      for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
      {
        // load downscaled line

        vline=0;
        nline=0;

        for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
        {
          in.seekg(pos+static_cast<std::streamoff>((y+k)*ds+kk)*width*depth+
                   static_cast<std::streamoff>(std::max(0l, x))*ds*depth);

          std::streambuf *sb=in.rdbuf();

          long j=std::max(0l, -x)*depth;

          for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
          {
            for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
            {
              for (int d=0; d<depth; d++)
              {
                ImageU8::store_t v=static_cast<ImageU8::store_t>(sb->sbumpc());

                if (image.isValidS(v))
                {
                  vline[j+d]+=v;
                  nline[j+d]++;
                }
              }
            }

            j+=depth;
          }
        }

        // store line into image

        long j=std::max(0l, -x)*depth;

        for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
        {
          for (int d=0; d<depth; d++)
          {
            if (nline[j] > 0)
            {
              image.set(i, k, d, static_cast<ImageU8::store_t>(vline[j]/nline[j]));
            }

            j++;
          }
        }
      }
    }
    else // load whole image
    {
      in.seekg(pos);
      std::streambuf *sb=in.rdbuf();

      for (long k=0; k<height; k++)
      {
        for (long i=0; i<width; i++)
        {
          for (int d=0; d<depth; d++)
          {
            image.set(i, k, d, static_cast<ImageU8::store_t>(sb->sbumpc()));
          }
        }
      }
    }

    in.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}